

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YedisCommand.cpp
# Opt level: O1

bool __thiscall Yedis::YCommand::addCommand(YCommand *this,string *cmd,YedisCommand *command)

{
  pointer pcVar1;
  byte bVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Yedis::YedisCommand_*>,_false,_true>,_bool>
  pVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  YedisCommand *local_30;
  
  if (cmd->_M_string_length == 0) {
    bVar2 = 1;
  }
  else {
    pcVar1 = (cmd->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + cmd->_M_string_length);
    local_30 = command;
    pVar3 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>,std::allocator<std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,Yedis::YedisCommand_const*>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>,std::allocator<std::pair<std::__cxx11::string_const,Yedis::YedisCommand_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this,(string *)local_50);
    bVar2 = pVar3.second;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool YCommand::addCommand(const std::string& cmd, const YedisCommand* command)
{
    if(cmd.empty())
    {
        return true;
    }

    return m_cmdInfo.insert(std::make_pair(cmd,command)).second;
}